

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall
QTextBrowserPrivate::setSource(QTextBrowserPrivate *this,QUrl *url,ResourceType type)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QTextBrowser *pQVar5;
  ulong uVar6;
  char *pcVar7;
  QTextDocument *pQVar8;
  QDebug *pQVar9;
  ResourceType in_EDX;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RSI;
  QTextBrowserPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  QByteArrayView QVar11;
  bool doSetText;
  QTextBrowser *q;
  QUrl baseUrl;
  QStringView firstTag;
  QByteArray ba;
  QString fileName;
  QUrl newUrlWithoutFragment;
  QUrl currentUrlWithoutFragment;
  QString txt;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QStringDecoder decoder;
  QVariant data;
  undefined4 in_stack_fffffffffffffbc8;
  CaseSensitivity in_stack_fffffffffffffbcc;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffbd0;
  QString *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffbe4;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  QUrl *pQVar13;
  undefined6 in_stack_fffffffffffffbf8;
  undefined6 uVar14;
  QChar in_stack_fffffffffffffbfe;
  undefined2 uVar15;
  QTextBrowser *in_stack_fffffffffffffc18;
  ResourceType local_34c;
  undefined1 local_330 [32];
  undefined1 local_310 [24];
  QUrl local_2f8 [5];
  QDebug local_2d0;
  QDebug local_2c8;
  QDebug local_2c0;
  QDebug local_2b8;
  QDebug local_2b0;
  QDebug local_2a8;
  QDebug local_2a0;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_294;
  undefined1 local_290 [32];
  undefined1 local_270 [28];
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_254;
  QUrl local_250;
  QUrl local_248;
  undefined8 local_23c;
  QChar local_232 [9];
  QStringView local_220;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_20c;
  undefined1 local_208 [48];
  char local_1d8 [56];
  EncodedData<const_QByteArray_&> local_1a0;
  storage_type *local_170;
  QByteArray local_160 [2];
  QUrl local_130 [2];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 local_108 [24];
  QUrl local_f0;
  undefined1 local_e8 [24];
  QUrl local_d0;
  QString local_c8;
  QCursor local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  QStringConverter local_60;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  bVar1 = QWidget::isVisible((QWidget *)0x6dd15a);
  if (bVar1) {
    QCursor::QCursor(&local_b0,WaitCursor);
    QGuiApplication::setOverrideCursor(&local_b0);
    QCursor::~QCursor(&local_b0);
  }
  in_RDI->textOrSourceChanged = true;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x6dd1d2);
  bVar1 = false;
  local_d0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_d0,(QUrl *)&in_RDI->currentURL);
  QString::QString((QString *)0x6dd20f);
  QUrl::setFragment((QString *)&local_d0,(ParsingMode)local_e8);
  QString::~QString((QString *)0x6dd233);
  local_f0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::resolved((QUrl *)&local_f0);
  QString::QString((QString *)0x6dd270);
  QUrl::setFragment((QString *)&local_f0,(ParsingMode)local_108);
  QString::~QString((QString *)0x6dd294);
  local_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbcc);
  QUrl::fileName((QFlags_conflict1 *)&local_120);
  local_34c = in_EDX;
  if (in_EDX == UnknownResource) {
    QVar10 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
    uVar6 = QString::endsWith((QLatin1String *)&local_120,(CaseSensitivity)QVar10.m_size);
    if ((uVar6 & 1) == 0) {
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
      uVar6 = QString::endsWith((QLatin1String *)&local_120,(CaseSensitivity)QVar10.m_size);
      if ((uVar6 & 1) == 0) {
        QVar10 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
        uVar6 = QString::endsWith((QLatin1String *)&local_120,(CaseSensitivity)QVar10.m_size);
        if ((uVar6 & 1) == 0) {
          local_34c = HtmlResource;
          goto LAB_006dd3fc;
        }
      }
    }
    local_34c = MarkdownResource;
  }
LAB_006dd3fc:
  in_RDI->currentType = local_34c;
  uVar6 = QUrl::isValid();
  if (((uVar6 & 1) != 0) &&
     ((bVar2 = ::operator!=((QUrl *)in_stack_fffffffffffffbd0,
                            (QUrl *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)),
      bVar2 || ((in_RDI->forceLoadOnSourceChange & 1U) != 0)))) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(in_RDI->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                           super_QFramePrivate.super_QWidgetPrivate + 0xc0))
              (local_130,in_RDI,in_RSI);
    (**(code **)(*(long *)&(pQVar5->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1c8))(&local_28,pQVar5,local_34c,local_130);
    QUrl::~QUrl(local_130);
    iVar4 = ::QVariant::userType((QVariant *)0x6dd4fd);
    if (iVar4 == 10) {
      ::QVariant::toString();
      QString::operator=((QString *)in_stack_fffffffffffffbd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QString::~QString((QString *)0x6dd539);
    }
    else {
      iVar4 = ::QVariant::userType((QVariant *)0x6dd54b);
      if (iVar4 == 0xc) {
        local_160[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_160[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_160[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toByteArray();
        if (local_34c == HtmlResource) {
          memset(&local_60,0xaa,0x38);
          QByteArrayView::QByteArrayView<QByteArray,_true>
                    ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                     ,(QByteArray *)in_stack_fffffffffffffbd8);
          QVar11.m_data = local_170;
          QVar11.m_size = (qsizetype)&local_60;
          QStringDecoder::decoderForHtml(QVar11);
          bVar2 = QStringConverter::isValid(&local_60);
          if (!bVar2) {
            QFlags<QStringConverterBase::Flag>::QFlags
                      ((QFlags<QStringConverterBase::Flag> *)in_stack_fffffffffffffbd0,
                       in_stack_fffffffffffffbcc);
            QStringDecoder::QStringDecoder
                      ((QStringDecoder *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
                       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
                       SUB84((ulong)in_stack_fffffffffffffbd8 >> 0x20,0));
            QStringDecoder::operator=
                      ((QStringDecoder *)in_stack_fffffffffffffbd0,
                       (QStringDecoder *)
                       CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
            QStringDecoder::~QStringDecoder((QStringDecoder *)0x6dd645);
          }
          local_1a0 = QStringDecoder::operator()((QStringDecoder *)&local_60,local_160);
          QStringDecoder::EncodedData::operator_cast_to_QString
                    ((EncodedData<const_QByteArray_&> *)
                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          QString::operator=((QString *)in_stack_fffffffffffffbd0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          QString::~QString((QString *)0x6dd6a1);
          QStringDecoder::~QStringDecoder((QStringDecoder *)0x6dd6ae);
        }
        else {
          QString::fromUtf8<void>((QByteArray *)in_stack_fffffffffffffbd0);
          QString::operator=((QString *)in_stack_fffffffffffffbd0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          QString::~QString((QString *)0x6dd6e7);
        }
        QByteArray::~QByteArray((QByteArray *)0x6dd6f4);
      }
    }
    bVar2 = QString::isEmpty((QString *)0x6dd703);
    in_stack_fffffffffffffc18 = pQVar5;
    if (bVar2) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (char *)in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_20c,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict *)local_208);
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      pcVar7 = QByteArray::constData((QByteArray *)0x6dd77d);
      QMessageLogger::warning(local_1d8,"QTextBrowser: No document for %s",pcVar7);
      QByteArray::~QByteArray((QByteArray *)0x6dd7a3);
      QString::~QString((QString *)0x6dd7b0);
      in_stack_fffffffffffffc18 = pQVar5;
    }
    bVar2 = QWidget::isVisible((QWidget *)0x6dd7bd);
    if (bVar2) {
      local_220.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_220.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 in_stack_fffffffffffffbd8);
      QChar::QChar<char16_t,_true>(local_232,L'>');
      QString::indexOf(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbfe,
                       (qsizetype)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
      local_220 = QStringView::left((QStringView *)
                                    CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                                    CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
      QVar10.m_size._4_4_ = in_stack_fffffffffffffbf4;
      QVar10.m_size._0_4_ = in_stack_fffffffffffffbf0;
      QVar10.m_data._0_6_ = in_stack_fffffffffffffbf8;
      QVar10.m_data._6_2_ = in_stack_fffffffffffffbfe.ucs;
      bVar2 = QStringView::startsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),QVar10,
                         CaseInsensitive);
      if (!bVar2) goto LAB_006dd960;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
      s.m_size._4_4_ = in_stack_fffffffffffffbe4;
      s.m_size._0_4_ = in_stack_fffffffffffffbe0;
      s.m_data._0_7_ = in_stack_fffffffffffffbe8;
      s.m_data._7_1_ = in_stack_fffffffffffffbef;
      bVar2 = QStringView::contains
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),s,
                         CaseInsensitive);
      if (!bVar2) goto LAB_006dd960;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
      s_00.m_size._4_4_ = in_stack_fffffffffffffbe4;
      s_00.m_size._0_4_ = in_stack_fffffffffffffbe0;
      s_00.m_data._0_7_ = in_stack_fffffffffffffbe8;
      s_00.m_data._7_1_ = in_stack_fffffffffffffbef;
      bVar2 = QStringView::contains
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),s_00,
                         CaseInsensitive);
      if (!bVar2) goto LAB_006dd960;
      QGuiApplication::restoreOverrideCursor();
      local_23c = QCursor::pos();
      QWhatsThis::showText
                ((QPoint *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (QString *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                 (QWidget *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      bVar2 = true;
    }
    else {
LAB_006dd960:
      (**(code **)(*(long *)&(in_RDI->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                             super_QFramePrivate.super_QWidgetPrivate + 0xc0))
                (&local_248,in_RDI,in_RSI);
      QUrl::operator=((QUrl *)in_stack_fffffffffffffbd0,
                      (QUrl *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QUrl::~QUrl(&local_248);
      bVar1 = true;
      bVar2 = false;
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
    if (bVar2) goto LAB_006ddeb1;
  }
  uVar6 = QUrl::isValid();
  if ((uVar6 & 1) == 0) {
    QUrl::operator=(&in_RDI->home,(QUrl *)in_RSI);
  }
  if (bVar1) {
    local_250.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_254,RemoveFilename);
    QUrl::adjusted((QUrlTwoFlags_conflict *)&local_250);
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    QUrl::path((QFlags_conflict1 *)local_270);
    bVar1 = QString::isEmpty((QString *)0x6dda92);
    QString::~QString((QString *)0x6ddaa5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pQVar8 = QTextEdit::document((QTextEdit *)in_stack_fffffffffffffbd0);
      QTextDocument::setBaseUrl((QUrl *)pQVar8);
    }
    pQVar8 = QTextEdit::document((QTextEdit *)in_stack_fffffffffffffbd0);
    uVar14 = SUB86(pQVar8,0);
    uVar15 = (undefined2)((ulong)pQVar8 >> 0x30);
    pQVar13 = &in_RDI->currentURL;
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_294,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags_conflict *)local_290);
    QTextDocument::setMetaInformation((MetaInformation)uVar14,(QString *)0x1);
    QString::~QString((QString *)0x6ddb3d);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    lcBrowser();
    anon_unknown.dwarf_eb4026::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffbd0,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_a8), bVar1) {
      anon_unknown.dwarf_eb4026::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x6ddb93);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (char *)in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (char *)0x6ddbac);
      QMessageLogger::debug();
      pQVar9 = QDebug::operator<<((QDebug *)
                                  CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                                  (char *)in_stack_fffffffffffffc18);
      QDebug::QDebug(&local_2c8,pQVar9);
      ::operator<<((QDebug *)&local_2c0,(QUrl *)&local_2c8);
      pQVar9 = QDebug::operator<<((QDebug *)
                                  CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                                  (char *)in_stack_fffffffffffffc18);
      QDebug::QDebug(&local_2b8,pQVar9);
      QTextEdit::document((QTextEdit *)in_stack_fffffffffffffbd0);
      QTextDocument::baseUrl();
      ::operator<<((QDebug *)&local_2b0,(QUrl *)&local_2b8);
      pQVar9 = QDebug::operator<<((QDebug *)
                                  CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                                  (char *)in_stack_fffffffffffffc18);
      QDebug::QDebug(&local_2a8,pQVar9);
      ::operator<<((QDebug *)CONCAT26(uVar15,uVar14),(ResourceType)((ulong)pQVar13 >> 0x20));
      QString::size(&local_c8);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffbd0,
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                         (char *)in_stack_fffffffffffffc18);
      QDebug::~QDebug(&local_2a0);
      QDebug::~QDebug(&local_2a8);
      QDebug::~QDebug(&local_2b0);
      QUrl::~QUrl(local_2f8);
      QDebug::~QDebug(&local_2b8);
      QDebug::~QDebug(&local_2c0);
      QDebug::~QDebug(&local_2c8);
      QDebug::~QDebug(&local_2d0);
      local_a0 = (undefined1 *)((ulong)local_a0 & 0xffffffffffffff00);
    }
    if (local_34c == MarkdownResource) {
      QTextEdit::setMarkdown
                ((QTextEdit *)in_stack_fffffffffffffbd0,
                 (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    else {
      QTextEdit::setHtml((QTextEdit *)in_stack_fffffffffffffbd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    QUrl::~QUrl(&local_250);
  }
  in_RDI->forceLoadOnSourceChange = false;
  uVar12 = SUB84(in_RSI,0);
  iVar4 = (int)((ulong)in_RSI >> 0x20);
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbcc);
  QUrl::fragment((QFlags_conflict1 *)local_310);
  bVar1 = QString::isEmpty((QString *)0x6dddd6);
  bVar3 = bVar1 ^ 0xff;
  QString::~QString((QString *)0x6ddde9);
  if ((bVar3 & 1) == 0) {
    QAbstractSlider::setValue((QAbstractSlider *)CONCAT17(bVar3,in_stack_fffffffffffffbe8),iVar4);
    QAbstractSlider::setValue((QAbstractSlider *)CONCAT17(bVar3,in_stack_fffffffffffffbe8),iVar4);
    in_RSI = in_stack_fffffffffffffbd0;
  }
  else {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_RSI,in_stack_fffffffffffffbcc);
    QUrl::fragment((QFlags_conflict1 *)local_330);
    QTextEdit::scrollToAnchor
              ((QTextEdit *)CONCAT17(bVar3,in_stack_fffffffffffffbe8),
               (QString *)CONCAT44(iVar4,uVar12));
    QString::~QString((QString *)0x6dde54);
  }
  bVar1 = QWidget::isVisible((QWidget *)0x6dde89);
  if (bVar1) {
    QGuiApplication::restoreOverrideCursor();
  }
  QTextBrowser::sourceChanged
            ((QTextBrowser *)in_RSI,
             (QUrl *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
LAB_006ddeb1:
  QString::~QString((QString *)0x6ddebe);
  QUrl::~QUrl(&local_f0);
  QUrl::~QUrl(&local_d0);
  QString::~QString((QString *)0x6ddee5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextBrowserPrivate::setSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_Q(QTextBrowser);
#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::setOverrideCursor(Qt::WaitCursor);
#endif
    textOrSourceChanged = true;

    QString txt;

    bool doSetText = false;

    QUrl currentUrlWithoutFragment = currentURL;
    currentUrlWithoutFragment.setFragment(QString());
    QUrl newUrlWithoutFragment = currentURL.resolved(url);
    newUrlWithoutFragment.setFragment(QString());
    QString fileName = url.fileName();
    if (type == QTextDocument::UnknownResource) {
#if QT_CONFIG(textmarkdownreader)
        if (fileName.endsWith(".md"_L1) ||
                fileName.endsWith(".mkd"_L1) ||
                fileName.endsWith(".markdown"_L1))
            type = QTextDocument::MarkdownResource;
        else
#endif
            type = QTextDocument::HtmlResource;
    }
    currentType = type;

    if (url.isValid()
        && (newUrlWithoutFragment != currentUrlWithoutFragment || forceLoadOnSourceChange)) {
        QVariant data = q->loadResource(type, resolveUrl(url));
        if (data.userType() == QMetaType::QString) {
            txt = data.toString();
        } else if (data.userType() == QMetaType::QByteArray) {
            QByteArray ba = data.toByteArray();
            if (type == QTextDocument::HtmlResource) {
                auto decoder = QStringDecoder::decoderForHtml(ba);
                if (!decoder.isValid())
                    // fall back to utf8
                    decoder = QStringDecoder(QStringDecoder::Utf8);
                txt = decoder(ba);
            } else {
                txt = QString::fromUtf8(ba);
            }
        }
        if (Q_UNLIKELY(txt.isEmpty()))
            qWarning("QTextBrowser: No document for %s", url.toString().toLatin1().constData());

        if (q->isVisible()) {
            const QStringView firstTag = QStringView{txt}.left(txt.indexOf(u'>') + 1);
            if (firstTag.startsWith("<qt"_L1) && firstTag.contains("type"_L1) && firstTag.contains("detail"_L1)) {
#ifndef QT_NO_CURSOR
                QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(whatsthis)
                QWhatsThis::showText(QCursor::pos(), txt, q);
#endif
                return;
            }
        }

        currentURL = resolveUrl(url);
        doSetText = true;
    }

    if (!home.isValid())
        home = url;

    if (doSetText) {
        // Setting the base URL helps QTextDocument::resource() to find resources with relative paths.
        // But don't set it unless it contains the document's path, because QTextBrowserPrivate::resolveUrl()
        // can already deal with local files on the filesystem in case the base URL was not set.
        QUrl baseUrl = currentURL.adjusted(QUrl::RemoveFilename);
        if (!baseUrl.path().isEmpty())
            q->document()->setBaseUrl(baseUrl);
        q->document()->setMetaInformation(QTextDocument::DocumentUrl, currentURL.toString());
        qCDebug(lcBrowser) << "loading" << currentURL << "base" << q->document()->baseUrl() << "type" << type << txt.size() << "chars";
#if QT_CONFIG(textmarkdownreader)
        if (type == QTextDocument::MarkdownResource)
            q->QTextEdit::setMarkdown(txt);
        else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
        q->QTextEdit::setHtml(txt);
#else
        q->QTextEdit::setPlainText(txt);
#endif

#ifdef QT_KEYPAD_NAVIGATION
        prevFocus.movePosition(QTextCursor::Start);
#endif
    }

    forceLoadOnSourceChange = false;

    if (!url.fragment().isEmpty()) {
        q->scrollToAnchor(url.fragment());
    } else {
        hbar->setValue(0);
        vbar->setValue(0);
    }
#ifdef QT_KEYPAD_NAVIGATION
    lastKeypadScrollValue = vbar->value();
    emitHighlighted(QUrl());
#endif

#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::restoreOverrideCursor();
#endif
    emit q->sourceChanged(url);
}